

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini-gmp.c
# Opt level: O1

void mpz_mul_2exp(__mpz_struct *r,__mpz_struct *u,mp_bitcnt_t bits)

{
  uint uVar1;
  mp_limb_t *pmVar2;
  ulong uVar3;
  uint uVar4;
  int iVar5;
  mp_ptr __s;
  byte bVar6;
  byte bVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  mp_ptr pmVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  long size;
  
  uVar1 = u->_mp_size;
  uVar8 = -uVar1;
  uVar4 = uVar1;
  if ((int)uVar1 < 1) {
    uVar4 = uVar8;
  }
  uVar14 = (ulong)uVar4;
  if (uVar1 == 0) {
    iVar5 = 0;
  }
  else {
    uVar10 = bits >> 6;
    size = ((bits & 0x3f) != 0) + uVar10 + uVar14;
    if (r->_mp_alloc < size) {
      __s = mpz_realloc(r,size);
    }
    else {
      __s = r->_mp_d;
    }
    pmVar2 = u->_mp_d;
    if ((bits & 0x3f) == 0) {
      if (uVar1 != uVar8 && SBORROW4(uVar1,uVar8) == (int)(uVar1 * 2) < 0) {
        uVar8 = uVar1;
      }
      lVar9 = (ulong)uVar8 + 1;
      do {
        __s[uVar10 + lVar9 + -2] = pmVar2[lVar9 + -2];
        lVar9 = lVar9 + -1;
      } while (1 < lVar9);
    }
    else {
      pmVar11 = __s + uVar10 + uVar14;
      bVar6 = (byte)bits & 0x3f;
      bVar7 = 0x40 - ((byte)bits & 0x3f);
      uVar12 = pmVar2[uVar14 - 1];
      uVar13 = uVar12 << bVar6;
      if (uVar14 != 1) {
        uVar14 = (ulong)uVar8;
        if (uVar1 != uVar8 && SBORROW4(uVar1,uVar8) == (int)(uVar1 * 2) < 0) {
          uVar14 = (ulong)uVar1;
        }
        do {
          uVar3 = pmVar2[uVar14 - 2];
          pmVar11[-1] = uVar3 >> (bVar7 & 0x3f) | uVar13;
          uVar13 = uVar3 << bVar6;
          pmVar11 = pmVar11 + -1;
          uVar14 = uVar14 - 1;
        } while (uVar14 != 1);
      }
      uVar12 = uVar12 >> (bVar7 & 0x3f);
      pmVar11[-1] = uVar13;
      __s[size + -1] = uVar12;
      size = size - (ulong)(uVar12 == 0);
    }
    if (0x3f < bits) {
      memset(__s,0,uVar10 << 3);
    }
    iVar5 = -(int)size;
    if (-1 < u->_mp_size) {
      iVar5 = (int)size;
    }
  }
  r->_mp_size = iVar5;
  return;
}

Assistant:

void
mpz_mul_2exp (mpz_t r, const mpz_t u, mp_bitcnt_t bits)
{
  mp_size_t un, rn;
  mp_size_t limbs;
  unsigned shift;
  mp_ptr rp;

  un = GMP_ABS (u->_mp_size);
  if (un == 0)
    {
      r->_mp_size = 0;
      return;
    }

  limbs = bits / GMP_LIMB_BITS;
  shift = bits % GMP_LIMB_BITS;

  rn = un + limbs + (shift > 0);
  rp = MPZ_REALLOC (r, rn);
  if (shift > 0)
    {
      mp_limb_t cy = mpn_lshift (rp + limbs, u->_mp_d, un, shift);
      rp[rn-1] = cy;
      rn -= (cy == 0);
    }
  else
    mpn_copyd (rp + limbs, u->_mp_d, un);

  mpn_zero (rp, limbs);

  r->_mp_size = (u->_mp_size < 0) ? - rn : rn;
}